

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotTree.cpp
# Opt level: O2

void __thiscall
cali::SnapshotTree::SnapshotTreeImpl::SnapshotTreeImpl
          (SnapshotTreeImpl *this,Attribute *attr,Variant *value)

{
  SnapshotTreeNode *this_00;
  
  this_00 = (SnapshotTreeNode *)operator_new(0xb8);
  SnapshotTreeNode::SnapshotTreeNode(this_00,attr,value);
  this->m_root = this_00;
  return;
}

Assistant:

SnapshotTreeImpl(const Attribute& attr, const Variant& value) : m_root(new SnapshotTreeNode(attr, value)) {}